

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  FILE *__stream;
  FILE *pFVar7;
  size_t sVar8;
  FILE *pFVar9;
  long *plVar10;
  string *unaff_RBP;
  char *__s;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  int EOP;
  int top_count;
  int bottom_count;
  int blob_index;
  int blob_count;
  int typeindex;
  int layer_count;
  int magic;
  string parambinpath;
  int id;
  int v;
  string include_guard_var;
  string param_var;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  int local_350;
  int local_34c;
  int local_348;
  uint local_344;
  uint local_340;
  int local_33c;
  FILE *local_338;
  int local_32c;
  int local_328 [2];
  char *local_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  char *local_2d8;
  FILE *local_2d0;
  FILE *local_2c8;
  undefined1 local_2bc [4];
  string local_2b8;
  string local_298;
  string local_278;
  string local_248 [8];
  string local_138 [8];
  
  if (argc == 5) {
    pcVar11 = argv[1];
    pcVar1 = argv[2];
    __filename = argv[3];
    local_320 = argv[4];
    pcVar5 = strrchr(pcVar11,0x2f);
    __s = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      __s = pcVar11;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,__s,(allocator<char> *)local_138);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_248);
    local_318 = &local_308;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_308 = *plVar10;
      lStack_300 = plVar6[3];
    }
    else {
      local_308 = *plVar10;
      local_318 = (long *)*plVar6;
    }
    local_310 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_2d8 = pcVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
    plVar6 = local_318;
    __stream = fopen(pcVar11,"rb");
    pFVar7 = fopen((char *)plVar6,"wb");
    local_338 = fopen(__filename,"wb");
    path_to_varname_abi_cxx11_(&local_298,pcVar11);
    path_to_varname_abi_cxx11_(&local_2b8,__filename);
    pFVar9 = local_338;
    fprintf(local_338,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fprintf(pFVar9,"#define NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fprintf(pFVar9,"namespace %s_id {\n",local_298._M_dataplus._M_p);
    local_328[1] = 0;
    __isoc99_fscanf(__stream,"%d");
    fwrite(local_328 + 1,4,1,pFVar7);
    local_328[0] = 0;
    local_33c = 0;
    __isoc99_fscanf(__stream,"%d %d");
    fwrite(local_328,4,1,pFVar7);
    fwrite(&local_33c,4,1,pFVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)local_328[0]);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)local_33c);
    local_340 = 0;
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      local_344 = 0;
      local_2d0 = __stream;
      local_2c8 = pFVar7;
      do {
        local_348 = 0;
        local_34c = 0;
        iVar2 = __isoc99_fscanf(__stream,"%32s %256s %d %d",&local_278,local_248,&local_348,
                                &local_34c);
        if (iVar2 == 4) {
          sanitize_name((char *)local_248);
          local_32c = ncnn::layer_to_index((char *)&local_278);
          fwrite(&local_32c,4,1,pFVar7);
          fwrite(&local_348,4,1,pFVar7);
          fwrite(&local_34c,4,1,pFVar7);
          fprintf(local_338,"const int LAYER_%s = %d;\n",local_248,(ulong)local_344);
          if (0 < local_348) {
            iVar2 = 0;
            do {
              iVar3 = __isoc99_fscanf(__stream,"%256s",local_138);
              if (iVar3 == 1) {
                sanitize_name((char *)local_138);
                bVar14 = blob_names_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         blob_names_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (bVar14) {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)blob_names_abi_cxx11_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar3 == 0) {
                    unaff_RBP = (string *)0x0;
                  }
                  else {
                    lVar13 = 0x20;
                    unaff_RBP = (string *)0x0;
                    do {
                      unaff_RBP = (string *)((long)&(unaff_RBP->_M_dataplus)._M_p + 1);
                      bVar14 = unaff_RBP <
                               (string *)
                               ((long)blob_names_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)blob_names_abi_cxx11_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5);
                      if (!bVar14) goto LAB_00107b1c;
                      iVar3 = std::__cxx11::string::compare
                                        ((char *)((long)&((blob_names_abi_cxx11_.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar13));
                      lVar13 = lVar13 + 0x20;
                    } while (iVar3 != 0);
                  }
                  bVar14 = true;
                }
LAB_00107b1c:
                if (!bVar14) {
                  fprintf(_stderr,"find_blob_index_by_name %s failed\n",local_138);
                  unaff_RBP = (string *)0xffffffff;
                }
                pFVar7 = local_2c8;
                local_2f8[0] = (long *)CONCAT44(local_2f8[0]._4_4_,(int)unaff_RBP);
                fwrite(local_2f8,4,1,local_2c8);
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 < local_348);
          }
          if (0 < local_34c) {
            iVar2 = 0;
            do {
              iVar3 = __isoc99_fscanf(__stream,"%256s",local_138);
              if (iVar3 == 1) {
                sanitize_name((char *)local_138);
                local_2f8[0] = local_2e8;
                sVar8 = strlen((char *)local_138);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2f8,local_138,
                           (long)&local_138[0]._M_dataplus._M_p + sVar8);
                uVar12 = local_340;
                std::__cxx11::string::operator=
                          ((string *)
                           (blob_names_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (int)local_340),
                           (string *)local_2f8);
                if (local_2f8[0] != local_2e8) {
                  operator_delete(local_2f8[0],local_2e8[0] + 1);
                }
                fprintf(local_338,"const int BLOB_%s = %d;\n",local_138,(ulong)uVar12);
                fwrite(&local_340,4,1,pFVar7);
                local_340 = local_340 + 1;
                __stream = local_2d0;
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 < local_34c);
          }
          local_2f8[0] = (long *)((ulong)local_2f8[0] & 0xffffffff00000000);
          while (iVar2 = __isoc99_fscanf(__stream,"%d=",local_2f8), iVar2 == 1) {
            fwrite(local_2f8,4,1,pFVar7);
            if ((int)local_2f8[0] < -0x5b03) {
              local_350 = 0;
              __isoc99_fscanf(__stream,"%d",&local_350);
              fwrite(&local_350,4,1,pFVar7);
              if (0 < local_350) {
                iVar2 = 0;
                do {
                  __isoc99_fscanf(__stream,",%15[^,\n ]",local_138);
                  bVar14 = vstr_is_float((char *)local_138);
                  if (bVar14) {
                    pcVar11 = "%f";
                  }
                  else {
                    pcVar11 = "%d";
                  }
                  __isoc99_sscanf(local_138,pcVar11,local_2bc);
                  fwrite(local_2bc,4,1,pFVar7);
                  iVar2 = iVar2 + 1;
                } while (iVar2 < local_350);
              }
            }
            else {
              __isoc99_fscanf(__stream,"%15s",local_138);
              bVar14 = vstr_is_float((char *)local_138);
              if (bVar14) {
                pcVar11 = "%f";
              }
              else {
                pcVar11 = "%d";
              }
              __isoc99_sscanf(local_138,pcVar11,&local_350);
              fwrite(&local_350,4,1,pFVar7);
            }
          }
          local_350 = -0xe9;
          fwrite(&local_350,4,1,pFVar7);
          unaff_RBP = local_248;
          local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
          sVar8 = strlen((char *)unaff_RBP);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,unaff_RBP,(long)&local_248[0]._M_dataplus._M_p + sVar8);
          std::__cxx11::string::operator=
                    ((string *)
                     (layer_names_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)local_344),
                     (string *)local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
            operator_delete(local_138[0]._M_dataplus._M_p,
                            local_138[0].field_2._M_allocated_capacity + 1);
          }
          local_344 = local_344 + 1;
        }
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    pFVar9 = local_338;
    fprintf(local_338,"} // namespace %s_id\n",local_298._M_dataplus._M_p);
    fprintf(pFVar9,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fclose(__stream);
    fclose(pFVar7);
    fclose(pFVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    plVar6 = local_318;
    pFVar9 = fopen(local_320,"wb");
    path_to_varname_abi_cxx11_(local_248,(char *)plVar6);
    path_to_varname_abi_cxx11_(local_138,local_320);
    pFVar7 = fopen((char *)plVar6,"rb");
    fprintf(pFVar9,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fprintf(pFVar9,"#define NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar9);
    fprintf(pFVar9,"static const unsigned char %s[] = {\n",local_248[0]._M_dataplus._M_p);
    uVar12 = 0;
    do {
      iVar2 = feof(pFVar7);
      if (iVar2 != 0) break;
      uVar4 = fgetc(pFVar7);
      if (uVar4 != 0xffffffff) {
        fprintf(pFVar9,"0x%02x,",(ulong)uVar4);
        uVar12 = uVar12 + 1;
        if ((uVar12 & 0xf) == 0) {
          fputc(10,pFVar9);
        }
      }
    } while (uVar4 != 0xffffffff);
    fwrite("};\n",3,1,pFVar9);
    fclose(pFVar7);
    pcVar11 = local_2d8;
    path_to_varname_abi_cxx11_(&local_278,local_2d8);
    pFVar7 = fopen(pcVar11,"rb");
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar9);
    fprintf(pFVar9,"static const unsigned char %s[] = {\n",local_278._M_dataplus._M_p);
    uVar12 = 0;
    do {
      iVar2 = feof(pFVar7);
      if (iVar2 != 0) break;
      uVar4 = fgetc(pFVar7);
      if (uVar4 != 0xffffffff) {
        fprintf(pFVar9,"0x%02x,",(ulong)uVar4);
        uVar12 = uVar12 + 1;
        if ((uVar12 & 0xf) == 0) {
          fputc(10,pFVar9);
        }
      }
    } while (uVar4 != 0xffffffff);
    fwrite("};\n",3,1,pFVar9);
    fprintf(pFVar9,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fclose(pFVar7);
    fclose(pFVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
      operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
      operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    iVar2 = 0;
  }
  else {
    main_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}